

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swap.cpp
# Opt level: O2

void __thiscall
OpenMD::RNEMD::SwapMethod::doRNEMDImpl
          (SwapMethod *this,SelectionManager *smanA,SelectionManager *smanB)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  double dVar3;
  byte bVar4;
  byte bVar5;
  StuntDouble *pSVar6;
  double *pdVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double local_f0;
  double local_e8;
  StuntDouble *local_e0;
  StuntDouble *local_d8;
  int selej;
  int selei;
  Vector3d angMom;
  Vector3d vel;
  Vector3d pos;
  Mat3x3d I;
  
  if ((this->super_RNEMD).doRNEMD_ != true) {
    return;
  }
  pSVar6 = SelectionManager::beginSelected(smanA,&selei);
  local_e8 = 0.0;
  bVar9 = true;
  local_d8 = (StuntDouble *)0x0;
  bVar5 = 0;
  while (pSVar6 != (StuntDouble *)0x0) {
    StuntDouble::getPos(&pos,pSVar6);
    if ((this->super_RNEMD).usePeriodicBoundaryConditions_ == true) {
      Snapshot::wrapVector((this->super_RNEMD).currentSnap_,&pos);
    }
    dVar11 = pSVar6->mass_;
    StuntDouble::getVel(&vel,pSVar6);
    dVar12 = 0.0;
    switch((this->super_RNEMD).rnemdFluxType_) {
    case rnemdKE:
      dVar12 = Vector<double,_3U>::lengthSquare(&vel.super_Vector<double,_3U>);
      dVar11 = dVar11 * dVar12;
      if (pSVar6->objType_ - otDAtom < 2) {
        StuntDouble::getJ(&angMom,pSVar6);
        (*pSVar6->_vptr_StuntDouble[5])(&I,pSVar6);
        if (pSVar6->linear_ == true) {
          uVar10 = (long)(pSVar6->linearAxis_ + 1) % 3 & 0xffffffff;
          uVar8 = (long)(pSVar6->linearAxis_ + 2) % 3 & 0xffffffff;
          dVar12 = angMom.super_Vector<double,_3U>.data_[uVar10];
          dVar3 = (dVar12 * dVar12) /
                  *(double *)
                   ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                   uVar10 * 0x20);
          dVar12 = angMom.super_Vector<double,_3U>.data_[uVar8];
          dVar12 = dVar12 * dVar12;
          pdVar7 = (double *)
                   ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                   uVar8 * 0x20);
        }
        else {
          auVar13._0_8_ =
               angMom.super_Vector<double,_3U>.data_[0] * angMom.super_Vector<double,_3U>.data_[0];
          auVar13._8_8_ =
               angMom.super_Vector<double,_3U>.data_[1] * angMom.super_Vector<double,_3U>.data_[1];
          auVar14._8_4_ =
               SUB84(I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1],0)
          ;
          auVar14._0_8_ =
               I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
          auVar14._12_4_ =
               (int)((ulong)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                            [1][1] >> 0x20);
          auVar14 = divpd(auVar13,auVar14);
          dVar3 = auVar14._8_8_ + auVar14._0_8_;
          dVar12 = angMom.super_Vector<double,_3U>.data_[2] *
                   angMom.super_Vector<double,_3U>.data_[2];
          pdVar7 = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2] + 2;
        }
        dVar11 = dVar11 + dVar12 / *pdVar7 + dVar3;
      }
      dVar12 = dVar11 * 0.5;
      break;
    case rnemdPx:
      dVar12 = dVar11 * vel.super_Vector<double,_3U>.data_[0];
      break;
    case rnemdPy:
      dVar12 = dVar11 * vel.super_Vector<double,_3U>.data_[1];
      break;
    case rnemdPz:
      dVar12 = dVar11 * vel.super_Vector<double,_3U>.data_[2];
    }
    if ((bVar9) || (local_e8 < dVar12)) {
      local_e8 = dVar12;
      local_d8 = pSVar6;
    }
    pSVar6 = SelectionManager::nextSelected(smanA,&selei);
    bVar5 = 1;
    bVar9 = false;
  }
  pSVar6 = SelectionManager::beginSelected(smanB,&selej);
  local_f0 = 0.0;
  bVar9 = true;
  local_e0 = (StuntDouble *)0x0;
  bVar4 = 0;
  while (pSVar6 != (StuntDouble *)0x0) {
    StuntDouble::getPos(&pos,pSVar6);
    if ((this->super_RNEMD).usePeriodicBoundaryConditions_ == true) {
      Snapshot::wrapVector((this->super_RNEMD).currentSnap_,&pos);
    }
    dVar11 = pSVar6->mass_;
    StuntDouble::getVel(&vel,pSVar6);
    dVar12 = 0.0;
    switch((this->super_RNEMD).rnemdFluxType_) {
    case rnemdKE:
      dVar12 = Vector<double,_3U>::lengthSquare(&vel.super_Vector<double,_3U>);
      dVar11 = dVar11 * dVar12;
      if (pSVar6->objType_ - otDAtom < 2) {
        StuntDouble::getJ(&angMom,pSVar6);
        (*pSVar6->_vptr_StuntDouble[5])(&I,pSVar6);
        if (pSVar6->linear_ == true) {
          uVar10 = (long)(pSVar6->linearAxis_ + 1) % 3 & 0xffffffff;
          uVar8 = (long)(pSVar6->linearAxis_ + 2) % 3 & 0xffffffff;
          dVar12 = angMom.super_Vector<double,_3U>.data_[uVar10];
          dVar3 = (dVar12 * dVar12) /
                  *(double *)
                   ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                   uVar10 * 0x20);
          dVar12 = angMom.super_Vector<double,_3U>.data_[uVar8];
          dVar12 = dVar12 * dVar12;
          pdVar7 = (double *)
                   ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                   uVar8 * 0x20);
        }
        else {
          auVar15._0_8_ =
               angMom.super_Vector<double,_3U>.data_[0] * angMom.super_Vector<double,_3U>.data_[0];
          auVar15._8_8_ =
               angMom.super_Vector<double,_3U>.data_[1] * angMom.super_Vector<double,_3U>.data_[1];
          auVar2._8_4_ = SUB84(I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                               data_[1][1],0);
          auVar2._0_8_ = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                         [0];
          auVar2._12_4_ =
               (int)((ulong)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                            [1][1] >> 0x20);
          auVar14 = divpd(auVar15,auVar2);
          dVar3 = auVar14._8_8_ + auVar14._0_8_;
          dVar12 = angMom.super_Vector<double,_3U>.data_[2] *
                   angMom.super_Vector<double,_3U>.data_[2];
          pdVar7 = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2] + 2;
        }
        dVar11 = dVar11 + dVar12 / *pdVar7 + dVar3;
      }
      dVar12 = dVar11 * 0.5;
      break;
    case rnemdPx:
      dVar12 = dVar11 * vel.super_Vector<double,_3U>.data_[0];
      break;
    case rnemdPy:
      dVar12 = dVar11 * vel.super_Vector<double,_3U>.data_[1];
      break;
    case rnemdPz:
      dVar12 = dVar11 * vel.super_Vector<double,_3U>.data_[2];
    }
    if ((bVar9) || (dVar12 < local_f0)) {
      local_f0 = dVar12;
      local_e0 = pSVar6;
    }
    pSVar6 = SelectionManager::nextSelected(smanB,&selej);
    bVar4 = 1;
    bVar9 = false;
  }
  if (!(bool)(bVar5 & bVar4)) {
    memcpy(&painCave,
           "Swap exchange NOT performed because selected object\n\twas not present in at least one of the two slabs.\n"
           ,0x68);
LAB_001f31f1:
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
    puVar1 = &(this->super_RNEMD).failTrialCount_;
    *puVar1 = *puVar1 + 1;
    return;
  }
  if (local_e8 <= local_f0) {
    builtin_strncpy(painCave.errMsg + 0x30,"_val > max_val\n",0x10);
    builtin_strncpy(painCave.errMsg + 0x20,"rmed because min",0x10);
    builtin_strncpy(painCave.errMsg + 0x10,"change NOT perfo",0x10);
    builtin_strncpy(painCave.errMsg,"RNEMD::doSwap ex",0x10);
    goto LAB_001f31f1;
  }
  StuntDouble::getVel((Vector3d *)&I,local_e0);
  StuntDouble::getVel(&pos,local_d8);
  dVar3 = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
  dVar12 = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
  dVar11 = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  uVar8 = (ulong)(this->super_RNEMD).rnemdFluxType_;
  switch(uVar8) {
  case 0:
    StuntDouble::setVel(local_e0,&pos);
    StuntDouble::setVel(local_d8,(Vector3d *)&I);
    if ((local_e0->objType_ - otDAtom < 2) && (local_d8->objType_ - otDAtom < 2)) {
      StuntDouble::getJ(&vel,local_e0);
      StuntDouble::getJ(&angMom,local_d8);
      StuntDouble::setJ(local_e0,&angMom);
      StuntDouble::setJ(local_d8,&vel);
    }
    goto LAB_001f328a;
  default:
    goto switchD_001f3107_caseD_1;
  case 3:
    I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         pos.super_Vector<double,_3U>.data_[0];
    pos.super_Vector<double,_3U>.data_[0] = dVar11;
    break;
  case 4:
    I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
         pos.super_Vector<double,_3U>.data_[1];
    pos.super_Vector<double,_3U>.data_[1] = dVar12;
    break;
  case 5:
    I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
         pos.super_Vector<double,_3U>.data_[2];
    pos.super_Vector<double,_3U>.data_[2] = dVar3;
  }
  StuntDouble::setVel(local_e0,(Vector3d *)&I);
  StuntDouble::setVel(local_d8,&pos);
LAB_001f328a:
  uVar8 = (ulong)(this->super_RNEMD).rnemdFluxType_;
switchD_001f3107_caseD_1:
  if (((uint)uVar8 < 6) && ((0x39U >> ((uint)uVar8 & 0x1f) & 1) != 0)) {
    *(double *)
     ((long)((this->super_RNEMD).hmat_.super_SquareMatrix<double,_3>.
             super_RectMatrix<double,_3U,_3U>.data_ + -1) + *(long *)(&DAT_00249690 + uVar8 * 8)) =
         (local_e8 - local_f0) +
         *(double *)
          ((long)((this->super_RNEMD).hmat_.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_ + -1) +
          *(long *)(&DAT_00249690 + uVar8 * 8));
  }
  return;
}

Assistant:

void SwapMethod::doRNEMDImpl(SelectionManager& smanA,
                               SelectionManager& smanB) {
    if (!doRNEMD_) return;
    int selei;
    int selej;

    StuntDouble* sd;

    RealType min_val(0.0);
    int min_found       = 0;
    StuntDouble* min_sd = NULL;

    RealType max_val(0.0);
    int max_found       = 0;
    StuntDouble* max_sd = NULL;

    for (sd = smanA.beginSelected(selei); sd != NULL;
         sd = smanA.nextSelected(selei)) {
      Vector3d pos = sd->getPos();

      // wrap the stuntdouble's position back into the box:

      if (usePeriodicBoundaryConditions_) currentSnap_->wrapVector(pos);

      RealType mass = sd->getMass();
      Vector3d vel  = sd->getVel();
      RealType value(0.0);

      switch (rnemdFluxType_) {
      case rnemdKE:

        value = mass * vel.lengthSquare();

        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ();
          Mat3x3d I       = sd->getI();

          if (sd->isLinear()) {
            int i = sd->linearAxis();
            int j = (i + 1) % 3;
            int k = (i + 2) % 3;
            value += angMom[j] * angMom[j] / I(j, j) +
                     angMom[k] * angMom[k] / I(k, k);
          } else {
            value += angMom[0] * angMom[0] / I(0, 0) +
                     angMom[1] * angMom[1] / I(1, 1) +
                     angMom[2] * angMom[2] / I(2, 2);
          }
        }  // angular momenta exchange enabled
        value *= 0.5;
        break;
      case rnemdPx:
        value = mass * vel[0];
        break;
      case rnemdPy:
        value = mass * vel[1];
        break;
      case rnemdPz:
        value = mass * vel[2];
        break;
      default:
        break;
      }
      if (!max_found) {
        max_val   = value;
        max_sd    = sd;
        max_found = 1;
      } else {
        if (max_val < value) {
          max_val = value;
          max_sd  = sd;
        }
      }
    }

    for (sd = smanB.beginSelected(selej); sd != NULL;
         sd = smanB.nextSelected(selej)) {
      Vector3d pos = sd->getPos();

      // wrap the stuntdouble's position back into the box:

      if (usePeriodicBoundaryConditions_) currentSnap_->wrapVector(pos);

      RealType mass = sd->getMass();
      Vector3d vel  = sd->getVel();
      RealType value(0.0);

      switch (rnemdFluxType_) {
      case rnemdKE:

        value = mass * vel.lengthSquare();

        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ();
          Mat3x3d I       = sd->getI();

          if (sd->isLinear()) {
            int i = sd->linearAxis();
            int j = (i + 1) % 3;
            int k = (i + 2) % 3;
            value += angMom[j] * angMom[j] / I(j, j) +
                     angMom[k] * angMom[k] / I(k, k);
          } else {
            value += angMom[0] * angMom[0] / I(0, 0) +
                     angMom[1] * angMom[1] / I(1, 1) +
                     angMom[2] * angMom[2] / I(2, 2);
          }
        }  // angular momenta exchange enabled
        value *= 0.5;
        break;
      case rnemdPx:
        value = mass * vel[0];
        break;
      case rnemdPy:
        value = mass * vel[1];
        break;
      case rnemdPz:
        value = mass * vel[2];
        break;
      default:
        break;
      }

      if (!min_found) {
        min_val   = value;
        min_sd    = sd;
        min_found = 1;
      } else {
        if (min_val > value) {
          min_val = value;
          min_sd  = sd;
        }
      }
    }

#ifdef IS_MPI
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);

    int my_min_found = min_found;
    int my_max_found = max_found;

    // Even if we didn't find a minimum, did someone else?
    MPI_Allreduce(&my_min_found, &min_found, 1, MPI_INT, MPI_LOR,
                  MPI_COMM_WORLD);
    // Even if we didn't find a maximum, did someone else?
    MPI_Allreduce(&my_max_found, &max_found, 1, MPI_INT, MPI_LOR,
                  MPI_COMM_WORLD);
#endif

    if (max_found && min_found) {
#ifdef IS_MPI
      struct {
        RealType val;
        int rank;
      } max_vals, min_vals;

      if (my_min_found) {
        min_vals.val = min_val;
      } else {
        min_vals.val = HONKING_LARGE_VALUE;
      }
      min_vals.rank = worldRank;

      // Who had the minimum?
      MPI_Allreduce(&min_vals, &min_vals, 1, MPI_REALTYPE_INT, MPI_MINLOC,
                    MPI_COMM_WORLD);
      min_val = min_vals.val;

      if (my_max_found) {
        max_vals.val = max_val;
      } else {
        max_vals.val = -HONKING_LARGE_VALUE;
      }
      max_vals.rank = worldRank;

      // Who had the maximum?
      MPI_Allreduce(&max_vals, &max_vals, 1, MPI_REALTYPE_INT, MPI_MAXLOC,
                    MPI_COMM_WORLD);
      max_val = max_vals.val;
#endif

      if (min_val < max_val) {
#ifdef IS_MPI
        if (max_vals.rank == worldRank && min_vals.rank == worldRank) {
          // I have both maximum and minimum, so proceed like a single
          // processor version:
#endif

          Vector3d min_vel = min_sd->getVel();
          Vector3d max_vel = max_sd->getVel();
          RealType temp_vel;

          switch (rnemdFluxType_) {
          case rnemdKE:
            min_sd->setVel(max_vel);
            max_sd->setVel(min_vel);
            if (min_sd->isDirectional() && max_sd->isDirectional()) {
              Vector3d min_angMom = min_sd->getJ();
              Vector3d max_angMom = max_sd->getJ();
              min_sd->setJ(max_angMom);
              max_sd->setJ(min_angMom);
            }  // angular momenta exchange enabled
               // assumes same rigid body identity
            break;
          case rnemdPx:
            temp_vel    = min_vel.x();
            min_vel.x() = max_vel.x();
            max_vel.x() = temp_vel;
            min_sd->setVel(min_vel);
            max_sd->setVel(max_vel);
            break;
          case rnemdPy:
            temp_vel    = min_vel.y();
            min_vel.y() = max_vel.y();
            max_vel.y() = temp_vel;
            min_sd->setVel(min_vel);
            max_sd->setVel(max_vel);
            break;
          case rnemdPz:
            temp_vel    = min_vel.z();
            min_vel.z() = max_vel.z();
            max_vel.z() = temp_vel;
            min_sd->setVel(min_vel);
            max_sd->setVel(max_vel);
            break;
          default:
            break;
          }

#ifdef IS_MPI
          // the rest of the cases only apply in parallel simulations:
        } else if (max_vals.rank == worldRank) {
          // I had the max, but not the minimum

          Vector3d min_vel;
          Vector3d max_vel = max_sd->getVel();
          MPI_Status status;

          // point-to-point swap of the velocity vector
          MPI_Sendrecv(max_vel.getArrayPointer(), 3, MPI_REALTYPE,
                       min_vals.rank, 0, min_vel.getArrayPointer(), 3,
                       MPI_REALTYPE, min_vals.rank, 0, MPI_COMM_WORLD, &status);

          switch (rnemdFluxType_) {
          case rnemdKE:
            max_sd->setVel(min_vel);
            // angular momenta exchange enabled
            if (max_sd->isDirectional()) {
              Vector3d min_angMom;
              Vector3d max_angMom = max_sd->getJ();

              // point-to-point swap of the angular momentum vector
              MPI_Sendrecv(max_angMom.getArrayPointer(), 3, MPI_REALTYPE,
                           min_vals.rank, 1, min_angMom.getArrayPointer(), 3,
                           MPI_REALTYPE, min_vals.rank, 1, MPI_COMM_WORLD,
                           &status);

              max_sd->setJ(min_angMom);
            }
            break;
          case rnemdPx:
            max_vel.x() = min_vel.x();
            max_sd->setVel(max_vel);
            break;
          case rnemdPy:
            max_vel.y() = min_vel.y();
            max_sd->setVel(max_vel);
            break;
          case rnemdPz:
            max_vel.z() = min_vel.z();
            max_sd->setVel(max_vel);
            break;
          default:
            break;
          }
        } else if (min_vals.rank == worldRank) {
          // I had the minimum but not the maximum:

          Vector3d max_vel;
          Vector3d min_vel = min_sd->getVel();
          MPI_Status status;

          // point-to-point swap of the velocity vector
          MPI_Sendrecv(min_vel.getArrayPointer(), 3, MPI_REALTYPE,
                       max_vals.rank, 0, max_vel.getArrayPointer(), 3,
                       MPI_REALTYPE, max_vals.rank, 0, MPI_COMM_WORLD, &status);

          switch (rnemdFluxType_) {
          case rnemdKE:
            min_sd->setVel(max_vel);
            // angular momenta exchange enabled
            if (min_sd->isDirectional()) {
              Vector3d min_angMom = min_sd->getJ();
              Vector3d max_angMom;

              // point-to-point swap of the angular momentum vector
              MPI_Sendrecv(min_angMom.getArrayPointer(), 3, MPI_REALTYPE,
                           max_vals.rank, 1, max_angMom.getArrayPointer(), 3,
                           MPI_REALTYPE, max_vals.rank, 1, MPI_COMM_WORLD,
                           &status);

              min_sd->setJ(max_angMom);
            }
            break;
          case rnemdPx:
            min_vel.x() = max_vel.x();
            min_sd->setVel(min_vel);
            break;
          case rnemdPy:
            min_vel.y() = max_vel.y();
            min_sd->setVel(min_vel);
            break;
          case rnemdPz:
            min_vel.z() = max_vel.z();
            min_sd->setVel(min_vel);
            break;
          default:
            break;
          }
        }
#endif

        switch (rnemdFluxType_) {
        case rnemdKE:
          kineticExchange_ += max_val - min_val;
          break;
        case rnemdPx:
          momentumExchange_.x() += max_val - min_val;
          break;
        case rnemdPy:
          momentumExchange_.y() += max_val - min_val;
          break;
        case rnemdPz:
          momentumExchange_.z() += max_val - min_val;
          break;
        default:
          break;
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::doSwap exchange NOT performed "
                 "because min_val > max_val\n");
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_INFO;
        simError();
        failTrialCount_++;
      }
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Swap exchange NOT performed because selected object\n"
               "\twas not present in at least one of the two slabs.\n");
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_INFO;
      simError();
      failTrialCount_++;
    }
  }